

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall NavierStokesBase::InitialRedistribution(NavierStokesBase *this)

{
  bool bVar1;
  FabType FVar2;
  NavierStokesBase *pNVar3;
  FabFactory<amrex::FArrayBox> *pFVar4;
  long lVar5;
  long in_RDI;
  Array4<const_double> *in_stack_00000200;
  Array4<const_double> *in_stack_00000208;
  Array4<const_double> *in_stack_00000210;
  Array4<const_double> *in_stack_00000218;
  Array4<const_double> *in_stack_00000220;
  Array4<const_double> *in_stack_00000228;
  Array4<const_double> *in_stack_00000230;
  BCRec *in_stack_00000238;
  Geometry *in_stack_00000240;
  string *in_stack_00000248;
  int in_stack_00000250;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<const_double> vfrac;
  Array4<const_double> ccc;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_double> fcx;
  Box result;
  Array4<const_amrex::EBCellFlag> *flag;
  EBCellFlagFab *flagfab;
  EBFArrayBoxFactory *fact;
  Box *bx;
  MFIter mfi;
  MultiFab tmp;
  MultiFab *Smf;
  FillPatchIterator S_fpi;
  MultiFab *S_new;
  NavierStokesBase *in_stack_fffffffffffff128;
  AmrLevel *in_stack_fffffffffffff130;
  int start_comp;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff138;
  MFIter *mfi_00;
  FabArray<amrex::FArrayBox> *this_00;
  Array4<const_double> *in_stack_fffffffffffff148;
  StateData *in_stack_fffffffffffff150;
  FabArrayBase *in_stack_fffffffffffff158;
  Print *in_stack_fffffffffffff160;
  AmrLevel *in_stack_fffffffffffff168;
  FillPatchIterator *in_stack_fffffffffffff170;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff180;
  undefined4 in_stack_fffffffffffff190;
  int in_stack_fffffffffffff194;
  undefined4 in_stack_fffffffffffff1a0;
  undefined4 in_stack_fffffffffffff1a4;
  Box *bx_in;
  EBCellFlagFab *this_01;
  string local_d48 [160];
  string local_ca8 [160];
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_c08;
  FabArrayBase *pFStack_c00;
  int local_bf8 [18];
  _func_int **local_bb0;
  Long LStack_ba8;
  Long local_ba0;
  Real RStack_b98;
  Real local_b90;
  Real aRStack_b7c [4];
  _func_int **local_b58;
  Real RStack_b50;
  Real local_b48;
  Real RStack_b40;
  Real local_b38;
  Real aRStack_b24 [4];
  double *local_b00;
  Real RStack_af8;
  Real local_af0;
  double dStack_ae8;
  double local_ae0;
  float afStack_acc [3];
  Vector<int,_std::allocator<int>_> *local_ac0;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *pVStack_ab8;
  element_type *local_ab0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_aa8;
  element_type *local_aa0;
  int iStack_a90;
  undefined8 uStack_a8c;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> local_a68;
  StateDescriptor *pSStack_a60;
  Amr *local_a58;
  undefined8 uStack_a50;
  int iStack_a4c;
  element_type *local_a48;
  double *local_a10;
  Long LStack_a08;
  Long local_a00;
  Long LStack_9f8;
  Dim3 local_9f0 [4];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_9b8;
  element_type *peStack_9b0;
  Long local_9a8;
  Long LStack_9a0;
  Dim3 local_998 [2];
  int iStack_980;
  undefined1 local_978 [52];
  Real RStack_944;
  undefined1 local_938 [16];
  Real local_928;
  Real RStack_920;
  Real RStack_918;
  Real RStack_904;
  undefined1 local_8f8 [52];
  float afStack_8c4 [3];
  MFIter local_8b8;
  undefined8 uStack_858;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff7c4;
  undefined8 flag_00;
  undefined8 U_in;
  undefined8 U_out;
  undefined4 ncomp;
  element_type *bx_00;
  Array4<const_double> local_7f8;
  undefined1 local_7b8 [76];
  pointer local_76c;
  pointer local_764;
  undefined4 local_75c;
  Array4<const_amrex::EBCellFlag> local_758;
  Array4<const_amrex::EBCellFlag> *local_718;
  EBCellFlagFab *local_710;
  long local_708;
  undefined1 local_6fc [132];
  pointer local_678;
  pointer pbStack_670;
  ShMem local_668 [17];
  EBCellFlagFab *local_4c8;
  FillPatchIterator local_4c0;
  Box *local_2b0;
  EBCellFlagFab *local_108;
  undefined4 local_fc;
  Ref *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  EBCellFlag *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff130,(char *)in_stack_fffffffffffff128);
  if (!bVar1) {
    if (verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffff160,(ostream *)in_stack_fffffffffffff158);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff130,(char (*) [33])in_stack_fffffffffffff128);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffff130,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)in_stack_fffffffffffff128);
      amrex::Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff1a4,in_stack_fffffffffffff1a0));
    }
    local_2b0 = (Box *)amrex::AmrLevel::get_new_data
                                 (in_stack_fffffffffffff130,
                                  (int)((ulong)in_stack_fffffffffffff128 >> 0x20));
    nghost_state(in_stack_fffffffffffff128);
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffff130,(size_type)in_stack_fffffffffffff128);
    uVar6 = (undefined4)((ulong)in_stack_fffffffffffff128 >> 0x20);
    amrex::StateData::curTime(in_stack_fffffffffffff150);
    pNVar3 = (NavierStokesBase *)CONCAT44(uVar6,NUM_STATE);
    amrex::FillPatchIterator::FillPatchIterator
              (in_stack_fffffffffffff170,in_stack_fffffffffffff168,
               (MultiFab *)in_stack_fffffffffffff160,(int)((ulong)in_stack_fffffffffffff158 >> 0x20)
               ,(Real)in_stack_fffffffffffff150,(int)((ulong)in_stack_fffffffffffff148 >> 0x20),
               (int)in_stack_fffffffffffff148,(int)in_stack_fffffffffffff180);
    local_4c8 = (EBCellFlagFab *)amrex::FillPatchIterator::get_mf(&local_4c0);
    nghost_state(pNVar3);
    local_668[0].alloc = false;
    local_668[0]._1_7_ = 0;
    local_668[0].n_values = 0;
    local_678 = (pointer)0x0;
    pbStack_670 = (pointer)0x0;
    local_668[0].n_points = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x537229);
    pNVar3 = (NavierStokesBase *)amrex::AmrLevel::Factory(in_stack_fffffffffffff130);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_fffffffffffff170,(BoxArray *)in_stack_fffffffffffff168,
               (DistributionMapping *)in_stack_fffffffffffff160,
               (int)((ulong)in_stack_fffffffffffff158 >> 0x20),(int)in_stack_fffffffffffff158,
               (MFInfo *)in_stack_fffffffffffff150,in_stack_fffffffffffff180);
    amrex::MFInfo::~MFInfo((MFInfo *)0x537282);
    this_01 = local_4c8;
    nghost_state(pNVar3);
    amrex::MultiFab::Copy
              ((MultiFab *)in_stack_fffffffffffff160,(MultiFab *)in_stack_fffffffffffff158,
               (int)((ulong)in_stack_fffffffffffff150 >> 0x20),(int)in_stack_fffffffffffff150,
               (int)((ulong)in_stack_fffffffffffff148 >> 0x20),(int)in_stack_fffffffffffff148);
    bx_in = local_2b0;
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_fffffffffffff160,in_stack_fffffffffffff158,
               SUB81((ulong)in_stack_fffffffffffff150 >> 0x38,0));
    while (bVar1 = amrex::MFIter::isValid((MFIter *)(local_6fc + 0x24)), bVar1) {
      amrex::MFIter::tilebox
                ((MFIter *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
      local_6fc._28_8_ = local_6fc;
      pFVar4 = amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x5373be);
      lVar5 = __dynamic_cast(pFVar4,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
      if (lVar5 == 0) {
        __cxa_bad_cast();
      }
      local_708 = lVar5;
      amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
                ((EBFArrayBoxFactory *)in_stack_fffffffffffff130);
      local_710 = amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                            ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff130,
                             (MFIter *)pNVar3);
      local_a8 = (local_710->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_b0 = &(local_710->super_BaseFab<amrex::EBCellFlag>).domain;
      local_b4 = (local_710->super_BaseFab<amrex::EBCellFlag>).nvar;
      local_5c = 0;
      local_88 = (local_b0->smallend).vect[0];
      local_6c = 1;
      iStack_84 = (local_710->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      local_d0.x = (local_b0->smallend).vect[0];
      local_d0.y = (local_b0->smallend).vect[1];
      local_7c = 2;
      local_d0.z = (local_710->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_8 = &(local_710->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_c = 0;
      local_38 = local_8->vect[0] + 1;
      local_18 = &(local_710->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_1c = 1;
      iStack_34 = (local_710->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      local_28 = &(local_710->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_2c = 2;
      local_f0.z = (local_710->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_f0.y = iStack_34;
      local_f0.x = local_38;
      local_108 = local_710;
      local_dc._0_8_ = local_f0._0_8_;
      local_dc.z = local_f0.z;
      local_c0._0_8_ = local_d0._0_8_;
      local_c0.z = local_d0.z;
      local_a0._0_8_ = local_d0._0_8_;
      local_a0.z = local_d0.z;
      local_90 = local_b0;
      local_80 = local_d0.z;
      local_78 = local_b0;
      local_68 = local_b0;
      local_58 = local_b0;
      local_50._0_8_ = local_f0._0_8_;
      local_50.z = local_f0.z;
      local_40 = local_b0;
      local_30 = local_f0.z;
      amrex::Array4<const_amrex::EBCellFlag>::Array4
                (&local_758,local_a8,&local_c0,&local_dc,local_b4);
      local_718 = &local_758;
      FVar2 = amrex::EBCellFlagFab::getType(this_01,bx_in);
      bVar1 = false;
      if (FVar2 != covered) {
        local_f8 = (Ref *)local_6fc._28_8_;
        local_fc = 4;
        local_7b8._68_8_ =
             (((Vector<int,_std::allocator<int>_> *)local_6fc._28_8_)->
             super_vector<int,_std::allocator<int>_>).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_76c = (((Vector<int,_std::allocator<int>_> *)local_6fc._28_8_)->
                    super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish;
        local_764 = (((Vector<int,_std::allocator<int>_> *)local_6fc._28_8_)->
                    super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage;
        local_75c = *(undefined4 *)
                     &(((Vector<int,_std::allocator<int>_> *)(local_6fc._28_8_ + 0x18))->
                      super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
        amrex::Box::grow((Box *)(local_7b8 + 0x44),4);
        FVar2 = amrex::EBCellFlagFab::getType(this_01,bx_in);
        bVar1 = FVar2 != regular;
      }
      if (bVar1) {
        amrex::Array4<const_double>::Array4((Array4<const_double> *)local_7b8);
        amrex::Array4<const_double>::Array4(&local_7f8);
        amrex::Array4<const_double>::Array4((Array4<const_double> *)&stack0xfffffffffffff7c8);
        amrex::Array4<const_double>::Array4((Array4<const_double> *)&local_8b8.local_index_map);
        amrex::Array4<const_double>::Array4((Array4<const_double> *)&local_8b8);
        amrex::Array4<const_double>::Array4((Array4<const_double> *)local_8f8);
        amrex::Array4<const_double>::Array4((Array4<const_double> *)local_938);
        amrex::Array4<const_double>::Array4((Array4<const_double> *)local_978);
        amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff130);
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff130,
                   (size_type)pNVar3);
        amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff130,(MFIter *)pNVar3);
        local_7b8._52_4_ = local_998[1].z;
        local_7b8._56_4_ = iStack_980;
        local_7b8._32_4_ = local_998[0].x;
        local_7b8._36_4_ = local_998[0].y;
        local_7b8._16_8_ = local_9a8;
        local_7b8._24_8_ = LStack_9a0;
        local_7b8._0_8_ = local_9b8;
        local_7b8._8_8_ = peStack_9b0;
        amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff130);
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff130,
                   (size_type)pNVar3);
        amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff130,(MFIter *)pNVar3);
        local_7f8.end.z = local_9f0[1].z;
        local_7f8.ncomp = local_9f0[2].x;
        local_7f8.begin.x = local_9f0[0].x;
        local_7f8.begin.y = local_9f0[0].y;
        local_7f8.kstride = local_a00;
        local_7f8.nstride = LStack_9f8;
        local_7f8.p = local_a10;
        local_7f8.jstride = LStack_a08;
        amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff130);
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff130,
                   (size_type)pNVar3);
        amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff130,(MFIter *)pNVar3);
        flag_00 = local_a68._M_head_impl;
        U_in = pSStack_a60;
        U_out = local_a58;
        bx_00 = local_a48;
        ncomp = iStack_a4c;
        amrex::EBFArrayBoxFactory::getCentroid((EBFArrayBoxFactory *)in_stack_fffffffffffff130);
        amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff130,(MFIter *)pNVar3);
        uVar7 = (undefined4)uStack_a8c;
        uVar8 = (undefined4)((ulong)uStack_a8c >> 0x20);
        uStack_858 = local_aa0;
        local_8b8.local_tile_index_map = (Vector<int,_std::allocator<int>_> *)local_ab0;
        local_8b8.num_local_tiles = (Vector<int,_std::allocator<int>_> *)p_Stack_aa8;
        local_8b8.local_index_map = local_ac0;
        local_8b8.tile_array = pVStack_ab8;
        uVar6 = iStack_a90;
        amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff130);
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff130,
                   (size_type)pNVar3);
        amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff130,(MFIter *)pNVar3);
        afStack_8c4[0] = afStack_acc[0];
        afStack_8c4[1] = afStack_acc[1];
        local_8f8._32_8_ = local_ae0;
        local_8f8._16_8_ = local_af0;
        local_8f8._24_8_ = dStack_ae8;
        local_8f8._0_8_ = local_b00;
        local_8f8._8_8_ = RStack_af8;
        amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff130);
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff130,
                   (size_type)pNVar3);
        amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff130,(MFIter *)pNVar3);
        RStack_904 = aRStack_b24[0];
        RStack_918 = local_b38;
        local_928 = local_b48;
        RStack_920 = RStack_b40;
        local_938._0_8_ = local_b58;
        local_938._8_8_ = RStack_b50;
        amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff130);
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff130,
                   (size_type)pNVar3);
        amrex::MultiCutFab::const_array((MultiCutFab *)in_stack_fffffffffffff130,(MFIter *)pNVar3);
        RStack_944 = aRStack_b7c[0];
        local_978._32_8_ = local_b90;
        local_978._16_8_ = local_ba0;
        local_978._24_8_ = RStack_b98;
        local_978._0_8_ = local_bb0;
        local_978._8_8_ = LStack_ba8;
        amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff130);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff138,(MFIter *)in_stack_fffffffffffff130);
        local_8b8._52_8_ = local_bf8._36_8_;
        local_8b8.currentIndex = local_bf8[4];
        local_8b8.beginIndex = local_bf8[5];
        local_8b8.tile_size.vect[0] = local_bf8[0];
        local_8b8.tile_size.vect[1] = local_bf8[1];
        local_8b8._24_8_ = local_bf8._8_8_;
        local_8b8.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                )local_c08._M_head_impl;
        local_8b8.fabArray = pFStack_c00;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff138,(MFIter *)in_stack_fffffffffffff130);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff138,(MFIter *)in_stack_fffffffffffff130);
        amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                  ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(in_RDI + 0xbc8));
        std::__cxx11::string::string(local_ca8,(string *)&redistribution_type_abi_cxx11_);
        this_00 = (FabArray<amrex::FArrayBox> *)local_7b8;
        mfi_00 = &local_8b8;
        start_comp = (int)((ulong)local_978 >> 0x20);
        Redistribution::ApplyToInitialData
                  ((Box *)bx_00,ncomp,(Array4<double> *)U_out,(Array4<double> *)U_in,
                   (Array4<const_amrex::EBCellFlag> *)flag_00,
                   (Array4<const_double> *)CONCAT44(in_stack_fffffffffffff7c4,uVar8),
                   in_stack_00000200,in_stack_00000208,in_stack_00000210,in_stack_00000218,
                   in_stack_00000220,in_stack_00000228,in_stack_00000230,in_stack_00000238,
                   in_stack_00000240,in_stack_00000248,in_stack_00000250,(Real)CONCAT44(uVar7,uVar6)
                  );
        std::__cxx11::string::~string(local_ca8);
        in_stack_fffffffffffff194 = NUM_SCALARS;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this_00,mfi_00,start_comp);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this_00,mfi_00,start_comp);
        in_stack_fffffffffffff160 =
             (Print *)amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::dataPtr
                                ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                                 (in_RDI + 0xbe0));
        std::__cxx11::string::string(local_d48,(string *)&redistribution_type_abi_cxx11_);
        in_stack_fffffffffffff158 = (FabArrayBase *)&local_8b8.local_index_map;
        in_stack_fffffffffffff150 = (StateData *)&stack0xfffffffffffff7c8;
        in_stack_fffffffffffff148 = &local_7f8;
        in_stack_fffffffffffff138 = (FabArray<amrex::FArrayBox> *)&local_8b8;
        in_stack_fffffffffffff130 = (AmrLevel *)local_978;
        pNVar3 = (NavierStokesBase *)local_938;
        Redistribution::ApplyToInitialData
                  ((Box *)bx_00,ncomp,(Array4<double> *)U_out,(Array4<double> *)U_in,
                   (Array4<const_amrex::EBCellFlag> *)flag_00,
                   (Array4<const_double> *)CONCAT44(in_stack_fffffffffffff7c4,uVar8),
                   in_stack_00000200,in_stack_00000208,in_stack_00000210,in_stack_00000218,
                   in_stack_00000220,in_stack_00000228,in_stack_00000230,in_stack_00000238,
                   in_stack_00000240,in_stack_00000248,in_stack_00000250,(Real)CONCAT44(uVar7,uVar6)
                  );
        std::__cxx11::string::~string(local_d48);
      }
      amrex::MFIter::operator++((MFIter *)(local_6fc + 0x24));
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffff130);
    amrex::MultiFab::Copy
              ((MultiFab *)in_stack_fffffffffffff160,(MultiFab *)in_stack_fffffffffffff158,
               (int)((ulong)in_stack_fffffffffffff150 >> 0x20),(int)in_stack_fffffffffffff150,
               (int)((ulong)in_stack_fffffffffffff148 >> 0x20),(int)in_stack_fffffffffffff148);
    amrex::MultiFab::~MultiFab((MultiFab *)0x537fc1);
    amrex::FillPatchIterator::~FillPatchIterator((FillPatchIterator *)in_stack_fffffffffffff130);
  }
  return;
}

Assistant:

void
NavierStokesBase::InitialRedistribution ()
{
    // Next we must redistribute the initial solution if we are going to use
    // MergeRedist or StateRedist redistribution schemes
    if ( redistribution_type != "StateRedist" ) {
        return;
    }

    if (verbose) {
      amrex::Print() << "Doing initial redistribution... " << std::endl;
    }

    // Initial data are set at new time step
    MultiFab& S_new = get_new_data(State_Type);
    // We must fill internal ghost values before calling redistribution
    // We also need any physical boundary conditions imposed if we are
    //    calling state redistribution (because that calls the slope routine)
    FillPatchIterator S_fpi(*this, S_new, nghost_state(), state[State_Type].curTime(),
                            State_Type, 0, NUM_STATE);
    MultiFab& Smf=S_fpi.get_mf();

    MultiFab tmp( grids, dmap, NUM_STATE, nghost_state(), MFInfo(), Factory() );
    MultiFab::Copy(tmp, Smf, 0, 0, NUM_STATE, nghost_state());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        auto const& fact =  dynamic_cast<EBFArrayBoxFactory const&>(S_new.Factory());

        EBCellFlagFab const& flagfab = fact.getMultiEBCellFlagFab()[mfi];
        Array4<EBCellFlag const> const& flag = flagfab.const_array();

        // FIXME? not sure if 4 is really needed or if 3 could do
        // But this is a safe choice
        if ( (flagfab.getType(bx) != FabType::covered) &&
             (flagfab.getType(amrex::grow(bx,4)) != FabType::regular) )
        {
            Array4<Real const> AMREX_D_DECL(fcx, fcy, fcz), ccc, vfrac, AMREX_D_DECL(apx, apy, apz);

            AMREX_D_TERM(fcx = fact.getFaceCent()[0]->const_array(mfi);,
                         fcy = fact.getFaceCent()[1]->const_array(mfi);,
                         fcz = fact.getFaceCent()[2]->const_array(mfi););

            ccc   = fact.getCentroid().const_array(mfi);

            AMREX_D_TERM(apx = fact.getAreaFrac()[0]->const_array(mfi);,
                         apy = fact.getAreaFrac()[1]->const_array(mfi);,
                         apz = fact.getAreaFrac()[2]->const_array(mfi););

            vfrac = fact.getVolFrac().const_array(mfi);

            //FIXME: this is a hack due to separate bcrecs Maybe want to put in single array.
            Redistribution::ApplyToInitialData( bx, AMREX_SPACEDIM,
                                                Smf.array(mfi), tmp.array(mfi),
                                                flag, AMREX_D_DECL(apx, apy, apz), vfrac,
                                                AMREX_D_DECL(fcx, fcy, fcz),
                                                ccc, m_bcrec_velocity_d.dataPtr(),
                                                geom, redistribution_type);
            Redistribution::ApplyToInitialData( bx,NUM_SCALARS,
                                                Smf.array(mfi,Density), tmp.array(mfi,Density),
                                                flag, AMREX_D_DECL(apx, apy, apz), vfrac,
                                                AMREX_D_DECL(fcx, fcy, fcz),
                                                ccc,m_bcrec_scalars_d.dataPtr(),
                                                geom, redistribution_type);
        }
    }

    MultiFab::Copy(S_new, Smf, 0, 0, NUM_STATE, 0);
}